

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usd-export.cc
# Opt level: O2

bool tinyusdz::tydra::detail::FlattenSkelNode
               (SkelNode *node,vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints,
               vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *jointNames,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *bindTransforms,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *restTransforms,string *err)

{
  SkelNode *pSVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  SkelNode *child;
  ulong uVar5;
  SkelNode *node_00;
  matrix4d *pmVar6;
  pointer pmVar7;
  bool bVar8;
  byte bVar9;
  Token local_50;
  
  bVar9 = 0;
  uVar5 = (ulong)node->joint_id;
  if (uVar5 < (ulong)((long)(joints->
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(joints->
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 5)) {
    Token::Token(&local_50,&node->joint_path);
    ::std::__cxx11::string::operator=
              ((string *)
               ((joints->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                _M_impl.super__Vector_impl_data._M_start + uVar5),(string *)&local_50);
    ::std::__cxx11::string::_M_dispose();
    Token::Token(&local_50,&node->joint_name);
    ::std::__cxx11::string::operator=
              ((string *)
               ((jointNames->super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>).
                _M_impl.super__Vector_impl_data._M_start + uVar5),(string *)&local_50);
    ::std::__cxx11::string::_M_dispose();
    lVar4 = 0x10;
    pmVar6 = &node->bind_transform;
    pmVar7 = (bindTransforms->
             super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
             )._M_impl.super__Vector_impl_data._M_start + uVar5;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      pmVar7->m[0][0] = pmVar6->m[0][0];
      pmVar6 = (matrix4d *)((long)pmVar6 + (ulong)bVar9 * -0x10 + 8);
      pmVar7 = (pointer)((long)pmVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    pmVar6 = &node->rest_transform;
    pmVar7 = (restTransforms->
             super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
             )._M_impl.super__Vector_impl_data._M_start + uVar5;
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      pmVar7->m[0][0] = pmVar6->m[0][0];
      pmVar6 = (matrix4d *)((long)pmVar6 + (ulong)bVar9 * -0x10 + 8);
      pmVar7 = (pointer)((long)pmVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    node_00 = (node->children).
              super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (node->children).
             super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar8 = node_00 == pSVar1;
      if (bVar8) {
        return bVar8;
      }
      bVar2 = FlattenSkelNode(node_00,joints,jointNames,bindTransforms,restTransforms,err);
      node_00 = node_00 + 1;
    } while (bVar2);
  }
  else {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

static bool FlattenSkelNode(const SkelNode &node,
  std::vector<value::token> &joints,
  std::vector<value::token> &jointNames,
  std::vector<value::matrix4d> &bindTransforms,
  std::vector<value::matrix4d> &restTransforms, std::string *err) {

  size_t idx = size_t(node.joint_id);
  if (idx >= joints.size()) {
    if (err) {
      (*err) += "joint_id out-of-bounds.";
    }
    return false;
  }

  joints[idx] = value::token(node.joint_path);
  jointNames[idx] = value::token(node.joint_name);
  bindTransforms[idx] = node.bind_transform;
  restTransforms[idx] = node.rest_transform;

  for (const auto &child : node.children) {
    if (!FlattenSkelNode(child, joints, jointNames, bindTransforms, restTransforms, err)) {
      return false;
    }
  }

  return true;
}